

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# null.cpp
# Opt level: O2

void __thiscall anon_unknown.dwarf_235b14::NullBackend::start(NullBackend *this)

{
  thread local_20;
  long *local_18;
  
  (this->mKillNow)._M_base._M_i = false;
  local_20._M_id._M_thread = (id)0;
  local_18 = (long *)::operator_new(0x20);
  *local_18 = (long)&PTR___State_001ac4e8;
  local_18[1] = (long)this;
  local_18[2] = (long)mixerProc;
  local_18[3] = 0;
  std::thread::_M_start_thread(&local_20,&local_18,0);
  if (local_18 != (long *)0x0) {
    (**(code **)(*local_18 + 8))();
  }
  std::thread::operator=(&this->mThread,&local_20);
  std::thread::~thread(&local_20);
  return;
}

Assistant:

void NullBackend::start()
{
    try {
        mKillNow.store(false, std::memory_order_release);
        mThread = std::thread{std::mem_fn(&NullBackend::mixerProc), this};
    }
    catch(std::exception& e) {
        throw al::backend_exception{ALC_INVALID_DEVICE, "Failed to start mixing thread: %s",
            e.what()};
    }
}